

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esfm_registers.c
# Opt level: O0

void ESFM_write_reg_buffered(esfm_chip *chip,uint16_t address,uint8_t data)

{
  size_t sVar1;
  esfm_write_buf *peVar2;
  esfm_write_buf *last_entry;
  esfm_write_buf *new_entry;
  uint64_t timestamp;
  uint8_t data_local;
  uint16_t address_local;
  esfm_chip *chip_local;
  
  peVar2 = chip->write_buf + chip->write_buf_end;
  sVar1 = chip->write_buf_end;
  if (peVar2->valid != '\0') {
    ESFM_write_reg(chip,peVar2->address,peVar2->data);
    chip->write_buf_start = chip->write_buf_end + 1 & 0x3ff;
  }
  peVar2->valid = '\x01';
  peVar2->address = address;
  peVar2->data = data;
  new_entry = (esfm_write_buf *)(chip->write_buf[sVar1 - 1 & 0x3ff].timestamp + 2);
  if (new_entry < (esfm_write_buf *)chip->write_buf_timestamp) {
    new_entry = (esfm_write_buf *)chip->write_buf_timestamp;
  }
  peVar2->timestamp = (uint64_t)new_entry;
  chip->write_buf_end = chip->write_buf_end + 1 & 0x3ff;
  return;
}

Assistant:

void
ESFM_write_reg_buffered (esfm_chip *chip, uint16_t address, uint8_t data)
{
	uint64_t timestamp;
	esfm_write_buf *new_entry, *last_entry;

	new_entry = &chip->write_buf[chip->write_buf_end];
	last_entry = &chip->write_buf[(chip->write_buf_end - 1) % ESFM_WRITEBUF_SIZE];

	if (new_entry->valid) {
		ESFM_write_reg(chip, new_entry->address, new_entry->data);
		chip->write_buf_start = (chip->write_buf_end + 1) % ESFM_WRITEBUF_SIZE;
	}

	new_entry->valid = 1;
	new_entry->address = address;
	new_entry->data = data;
	timestamp = last_entry->timestamp + ESFM_WRITEBUF_DELAY;
	if (timestamp < chip->write_buf_timestamp)
	{
		timestamp = chip->write_buf_timestamp;
	}

	new_entry->timestamp = timestamp;
	chip->write_buf_end = (chip->write_buf_end + 1) % ESFM_WRITEBUF_SIZE;
}